

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

HeapThunk * __thiscall
jsonnet::internal::(anonymous_namespace)::Heap::
makeEntity<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,jsonnet::internal::(anonymous_namespace)::HeapObject*&,unsigned_int&,jsonnet::internal::AST*&>
          (Heap *this,Identifier **args,HeapObject **args_1,uint *args_2,AST **args_3)

{
  AST *body;
  value_type pHVar1;
  value_type *in_RDI;
  HeapThunk *r;
  undefined8 in_stack_ffffffffffffffb8;
  uint offset;
  HeapObject *in_stack_ffffffffffffffc0;
  Identifier *in_stack_ffffffffffffffc8;
  HeapThunk *in_stack_ffffffffffffffd0;
  
  offset = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  body = (AST *)operator_new(0x70);
  anon_unknown_0::HeapThunk::HeapThunk
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,offset,
             body);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)body,in_RDI);
  (body->location).file._M_dataplus = *(_Alloc_hider *)(in_RDI + 2);
  pHVar1 = (value_type)
           std::
           vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
           ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                   *)(in_RDI + 3));
  in_RDI[7] = pHVar1;
  return (HeapThunk *)body;
}

Assistant:

T *makeEntity(Args &&... args)
    {
        T *r = new T(std::forward<Args>(args)...);
        entities.push_back(r);
        r->mark = lastMark;
        numEntities = entities.size();
        return r;
    }